

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O0

void __thiscall
CmdLineArgsParser::ParseNumberPairSet(CmdLineArgsParser *this,NumberPairSet *numberPairSet)

{
  char16 cVar1;
  uint32 x;
  undefined4 local_20;
  int col;
  int line;
  NumberPairSet *numberPairSet_local;
  CmdLineArgsParser *this_local;
  
  while( true ) {
    x = ParseInteger(this);
    local_20 = 0xffffffff;
    cVar1 = CurChar(this);
    if (cVar1 == L',') {
      NextChar(this);
      local_20 = ParseInteger(this);
    }
    Js::NumberPairSet::Add(numberPairSet,x,local_20);
    cVar1 = CurChar(this);
    if (cVar1 != L';') break;
    NextChar(this);
  }
  return;
}

Assistant:

void
CmdLineArgsParser::ParseNumberPairSet(Js::NumberPairSet * numberPairSet)
{
    while (true)
    {
        int line = ParseInteger();
        int col = -1;
        if (CurChar() == ',')
        {
            NextChar();
            col = ParseInteger();
        }

        numberPairSet->Add(line, col);

        if (CurChar() != ';')
        {
            break;
        }
        NextChar();
    }
}